

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::auto_fwd_resp_handler
          (raft_server *this,ptr<cmd_result<ptr<buffer>_>_> *presult,ptr<auto_fwd_pkg> *cur_pkg,
          ptr<rpc_client> *rpc_cli,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  element_type *peVar1;
  ptr<std::exception> perr;
  ptr<buffer> resp_ctx;
  shared_ptr<std::exception> local_78;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68._M_ptr = (element_type *)0x0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    peVar1 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1->accepted_ == true) {
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,
                 &(peVar1->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_68,&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
      ((presult->
       super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr)->accepted_ = true;
    }
  }
  else {
    std::__shared_ptr<std::exception,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<std::exception,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               &err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>);
  }
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
            ((presult->
             super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr,(shared_ptr<nuraft::buffer> *)&local_68,&local_78,OK);
  std::__shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &cur_pkg->
              super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&rpc_cli->super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>)
  ;
  auto_fwd_release_rpc_cli(this,(ptr<auto_fwd_pkg> *)&local_48,(ptr<rpc_client> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return;
}

Assistant:

void raft_server::auto_fwd_resp_handler( ptr<cmd_result<ptr<buffer>>> presult,
                                         ptr<auto_fwd_pkg> cur_pkg,
                                         ptr<rpc_client> rpc_cli,
                                         ptr<resp_msg>& resp,
                                         ptr<rpc_exception>& err )
{
    ptr<buffer> resp_ctx(nullptr);
    ptr<std::exception> perr;
    if (err) {
        perr = err;
    } else {
        if (resp->get_accepted()) {
            resp_ctx = resp->get_ctx();
            presult->accept();
        }
    }

    presult->set_result(resp_ctx, perr);
    auto_fwd_release_rpc_cli(cur_pkg, rpc_cli);
}